

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O1

Fl_Window * fl_find(Window xid)

{
  Fl_X *pFVar1;
  Fl_X *pFVar2;
  Fl_X **ppFVar3;
  
  if (Fl_X::first == (Fl_X *)0x0) {
    return (Fl_Window *)0x0;
  }
  pFVar2 = Fl_X::first;
  if (Fl_X::first->xid == xid) {
    ppFVar3 = &Fl_X::first;
  }
  else {
    do {
      pFVar1 = pFVar2;
      pFVar2 = pFVar1->next;
      if (pFVar2 == (Fl_X *)0x0) {
        return (Fl_Window *)0x0;
      }
    } while (pFVar2->xid != xid);
    ppFVar3 = &pFVar1->next;
  }
  if ((pFVar2 != Fl_X::first) && (Fl::modal_ == (Fl_Window *)0x0)) {
    *ppFVar3 = pFVar2->next;
    pFVar2->next = Fl_X::first;
    Fl_X::first = pFVar2;
  }
  return pFVar2->w;
}

Assistant:

Fl_Window* fl_find(Window xid) {
  Fl_X *window;
  for (Fl_X **pp = &Fl_X::first; (window = *pp); pp = &window->next)
   if (window->xid == xid) {
      if (window != Fl_X::first && !Fl::modal()) {
        // make this window be first to speed up searches
        // this is not done if modal is true to avoid messing up modal stack
        *pp = window->next;
        window->next = Fl_X::first;
        Fl_X::first = window;
      }
      return window->w;
    }
  return 0;
}